

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-opt.cpp
# Opt level: O0

void helper_after_test(char *func,bool high_level,string *options,string *subtest,bool subtest_ok,
                      int *ntest,int *npass)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte in_SIL;
  undefined8 in_RDI;
  byte in_R8B;
  int *in_R9;
  int *in_stack_00000008;
  
  pcVar1 = "no";
  if ((in_SIL & 1) != 0) {
    pcVar1 = "yes";
  }
  uVar2 = std::__cxx11::string::c_str();
  uVar3 = std::__cxx11::string::c_str();
  printf("  %s(high_level=%s%s, subtest=%s): ",in_RDI,pcVar1,uVar2,uVar3);
  if ((in_R8B & 1) == 0) {
    printf("\x1b[1;31mFAIL\x1b[0m\n");
  }
  else {
    printf("\x1b[1;32mOK\x1b[0m\n");
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  *in_R9 = *in_R9 + 1;
  return;
}

Assistant:

static void helper_after_test(
        const char * func, const bool high_level, const std::string options,
        const std::string subtest, const bool subtest_ok, int & ntest, int & npass) {
    printf("  %s(high_level=%s%s, subtest=%s): ",
           func, high_level ? "yes" : "no", options.c_str(), subtest.c_str());
    if (subtest_ok) {
        printf("\033[1;32mOK\033[0m\n");
        npass++;
    } else {
        printf("\033[1;31mFAIL\033[0m\n");
    }
    ntest++;
}